

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,double ax,double ay,double az)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_98;
  double local_88;
  double local_78;
  double local_48;
  
  dVar4 = cos(ay);
  dVar5 = cos(az);
  local_88 = cos(ay);
  local_88 = -local_88;
  dVar6 = sin(az);
  auVar1._8_4_ = SUB84(local_88 * dVar6,0);
  auVar1._0_8_ = dVar5 * dVar4;
  auVar1._12_4_ = (int)((ulong)(local_88 * dVar6) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->v[0] = auVar1;
  dVar4 = sin(ay);
  __return_storage_ptr__->v[0][2] = -dVar4;
  local_78 = sin(ax);
  local_78 = -local_78;
  dVar4 = sin(ay);
  dVar5 = cos(az);
  dVar6 = cos(ax);
  dVar7 = sin(az);
  dVar8 = sin(ax);
  dVar9 = sin(ay);
  dVar10 = sin(az);
  dVar11 = cos(ax);
  dVar12 = cos(az);
  dVar8 = dVar10 * dVar9 * dVar8 + dVar12 * dVar11;
  auVar2._8_4_ = SUB84(dVar8,0);
  auVar2._0_8_ = dVar5 * local_78 * dVar4 + dVar7 * dVar6;
  auVar2._12_4_ = (int)((ulong)dVar8 >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->v[1] = auVar2;
  local_98 = sin(ax);
  local_98 = -local_98;
  dVar4 = cos(ay);
  __return_storage_ptr__->v[1][2] = dVar4 * local_98;
  dVar4 = cos(ax);
  dVar5 = sin(ay);
  dVar6 = cos(az);
  dVar7 = sin(ax);
  dVar8 = sin(az);
  local_48 = cos(ax);
  local_48 = -local_48;
  dVar9 = sin(ay);
  dVar10 = sin(az);
  dVar11 = sin(ax);
  dVar12 = cos(az);
  dVar9 = dVar10 * local_48 * dVar9 + dVar12 * dVar11;
  auVar3._8_4_ = SUB84(dVar9,0);
  auVar3._0_8_ = dVar6 * dVar5 * dVar4 + dVar8 * dVar7;
  auVar3._12_4_ = (int)((ulong)dVar9 >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->v[2] = auVar3;
  dVar4 = cos(ax);
  dVar5 = cos(ay);
  __return_storage_ptr__->v[2][2] = dVar5 * dVar4;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(double ax, double ay, double az)
{
  Matrix33d ret;

  ret(0, 0)=cos(ay)*cos(az);
  ret(0, 1)=-cos(ay)*sin(az);
  ret(0, 2)=-sin(ay);

  ret(1, 0)=-sin(ax)*sin(ay)*cos(az)+cos(ax)*sin(az);
  ret(1, 1)=sin(ax)*sin(ay)*sin(az)+cos(ax)*cos(az);
  ret(1, 2)=-sin(ax)*cos(ay);

  ret(2, 0)=cos(ax)*sin(ay)*cos(az)+sin(ax)*sin(az);
  ret(2, 1)=-cos(ax)*sin(ay)*sin(az)+sin(ax)*cos(az);
  ret(2, 2)=cos(ax)*cos(ay);

  return ret;
}